

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

iterator * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
          (iterator *this)

{
  array<std::byte,_8UL> search_key;
  bool bVar1;
  ulong in_RAX;
  olc_node_ptr oVar2;
  undefined8 uStack_28;
  bool match;
  
  uStack_28 = in_RAX;
  oVar2 = current_node(this);
  if (oVar2.tagged_ptr != 0) {
    if ((oVar2.tagged_ptr & 7) != 0) {
      __assert_fail("node.type() == node_type::LEAF",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x88c,
                    "typename olc_db<Key, Value>::iterator &unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    search_key._M_elems =
         *&(((anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 *)(oVar2.tagged_ptr + 0x20)
            )->key_bytes)._M_elems;
    bVar1 = try_prior(this);
    if (!bVar1) {
      do {
        do {
          uStack_28 = uStack_28 & 0xffffffffffffff;
          bVar1 = try_seek(this,(art_key_type)search_key._M_elems,(bool *)((long)&uStack_28 + 7),
                           false);
        } while (!bVar1);
      } while ((uStack_28._7_1_ != '\0') && (bVar1 = try_prior(this), !bVar1));
    }
  }
  return this;
}

Assistant:

typename olc_db<Key, Value>::iterator& olc_db<Key, Value>::iterator::prior() {
  const auto node = current_node();
  if (node != nullptr) {
    UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
    const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf
    // TODO(thompsonbry) : variable length keys: We need a temporary
    // copy of the key since actions on the stack will make it
    // impossible to reconstruct the key.  So maybe we have two
    // internal buffers on the iterator to support this?
    const auto& akey = leaf->get_key();  // access the key on the leaf.
    if (UNODB_DETAIL_LIKELY(try_prior())) return *this;
    while (true) {
      bool match{};
      // seek to the current key (or its predecessor)
      if (!try_seek(akey, match, false /*fwd*/)) continue;
      if (!match) {
        // The key no longer exists, so its predecessor is the prior
        // leaf and we are done.
        return *this;
      }
      if (!try_prior()) continue;  // seek to the predecessor
      return *this;                // done.
    }
  }
  return *this;  // LCOV_EXCL_LINE
}